

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O1

void __thiscall HawkTracer::parser::ProtocolReader::wait_for_complete(ProtocolReader *this)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->_mtx_cv;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (((this->_is_running)._M_base._M_i & 1U) != 0) {
    do {
      std::condition_variable::wait((unique_lock *)&this->_cv);
    } while (((this->_is_running)._M_base._M_i & 1U) != 0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void ProtocolReader::wait_for_complete()
{
    std::unique_lock<std::mutex> l(_mtx_cv);
    _cv.wait(l, [this] { return !_is_running; });
}